

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_thread.h
# Opt level: O0

void __thiscall
AckThread::WaitAckSession::WaitAckSession
          (WaitAckSession *this,uint32_t session_id,string *dst_ip,uint16_t dst_port)

{
  uint16_t dst_port_local;
  string *dst_ip_local;
  uint32_t session_id_local;
  WaitAckSession *this_local;
  
  this->session_id = 0;
  std::__cxx11::string::string((string *)&this->dst_ip);
  this->dst_port = 0;
  std::__cxx11::list<WaitAckPacket,_std::allocator<WaitAckPacket>_>::list(&this->wait_ack_packets);
  this->previous_ack_base_packet_number = -1;
  this->previous_ack_packet_number_mask = -1;
  this->session_id = session_id;
  std::__cxx11::string::operator=((string *)&this->dst_ip,(string *)dst_ip);
  this->dst_port = dst_port;
  return;
}

Assistant:

WaitAckSession(uint32_t session_id, const std::string& dst_ip, uint16_t dst_port) {
			this->session_id = session_id;
			this->dst_ip = dst_ip;
			this->dst_port = dst_port;
		}